

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O0

spv_result_t
spvExtInstTableValueLookup
          (spv_ext_inst_table table,spv_ext_inst_type_t type,uint32_t value,
          spv_ext_inst_desc *pEntry)

{
  spv_ext_inst_group_t *psVar1;
  spv_ext_inst_desc_t *entry;
  uint32_t index;
  spv_ext_inst_group_t *group;
  uint32_t groupIndex;
  spv_ext_inst_desc *pEntry_local;
  uint32_t value_local;
  spv_ext_inst_type_t type_local;
  spv_ext_inst_table table_local;
  
  if (table == (spv_ext_inst_table)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_TABLE;
  }
  else if (pEntry == (spv_ext_inst_desc *)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_POINTER;
  }
  else {
    for (group._4_4_ = 0; group._4_4_ < table->count; group._4_4_ = group._4_4_ + 1) {
      psVar1 = table->groups + group._4_4_;
      if (type == psVar1->type) {
        for (entry._4_4_ = 0; entry._4_4_ < psVar1->count; entry._4_4_ = entry._4_4_ + 1) {
          if (value == psVar1->entries[entry._4_4_].ext_inst) {
            *pEntry = psVar1->entries + entry._4_4_;
            return SPV_SUCCESS;
          }
        }
      }
    }
    table_local._4_4_ = SPV_ERROR_INVALID_LOOKUP;
  }
  return table_local._4_4_;
}

Assistant:

spv_result_t spvExtInstTableValueLookup(const spv_ext_inst_table table,
                                        const spv_ext_inst_type_t type,
                                        const uint32_t value,
                                        spv_ext_inst_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint32_t groupIndex = 0; groupIndex < table->count; groupIndex++) {
    const auto& group = table->groups[groupIndex];
    if (type != group.type) continue;
    for (uint32_t index = 0; index < group.count; index++) {
      const auto& entry = group.entries[index];
      if (value == entry.ext_inst) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}